

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

shared_ptr<ear::PointSourcePanner> __thiscall ear::configurePolarPanner(ear *this,Layout *layout)

{
  bool bVar1;
  __type _Var2;
  internal_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  iterator iVar3;
  _Bit_iterator _Var4;
  shared_ptr<ear::PointSourcePanner> sVar5;
  _Bit_iterator __last;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  _Bit_type *local_d8;
  uint local_d0;
  _Bit_iterator_base local_c8;
  _Bit_type *local_b8;
  uint local_b0;
  bool local_91;
  _Bit_type *local_90;
  uint local_88;
  _Bit_type *local_80;
  uint local_78;
  _Bit_type *local_70;
  uint local_68;
  _Bit_type *local_60;
  uint local_58;
  _Bit_iterator_base local_50;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> isLfe;
  Layout *layout_local;
  
  isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)layout;
  Layout::isLfe((vector<bool,_std::allocator<bool>_> *)local_40,layout);
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_70 = iVar3.super__Bit_iterator_base._M_p;
  local_68 = iVar3.super__Bit_iterator_base._M_offset;
  local_60 = local_70;
  local_58 = local_68;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_90 = iVar3.super__Bit_iterator_base._M_p;
  local_88 = iVar3.super__Bit_iterator_base._M_offset;
  local_91 = true;
  _Var4.super__Bit_iterator_base._M_offset = local_58;
  _Var4.super__Bit_iterator_base._M_p = local_60;
  _Var4.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar3.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar3.super__Bit_iterator_base._0_12_,8);
  local_80 = local_90;
  local_78 = local_88;
  _Var4 = std::find<std::_Bit_iterator,bool>(_Var4,__last,&local_91);
  local_b8 = _Var4.super__Bit_iterator_base._M_p;
  local_b0 = _Var4.super__Bit_iterator_base._M_offset;
  local_50._M_p = local_b8;
  local_50._M_offset = local_b0;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_d8 = iVar3.super__Bit_iterator_base._M_p;
  local_d0 = iVar3.super__Bit_iterator_base._M_offset;
  local_c8._M_p = local_d8;
  local_c8._M_offset = local_d0;
  bVar1 = std::operator!=(&local_50,&local_c8);
  if (!bVar1) {
    checkScreenSpeakers((Layout *)
                        isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
    Layout::name_abi_cxx11_
              (&local_120,
               (Layout *)
               isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"0+2+0",&local_141);
    _Var2 = std::operator==(&local_120,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)&local_120);
    if (_Var2) {
      configureStereoPolarPanner
                (this,(Layout *)
                      isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    }
    else {
      configureFullPolarPanner
                (this,(Layout *)
                      isLfe.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_40);
    sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<ear::PointSourcePanner>)
           sVar5.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_fa = 1;
  this_00 = (internal_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"lfe channel passed to point source panner",&local_f9);
  internal_error::internal_error(this_00,&local_f8);
  local_fa = 0;
  __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

std::shared_ptr<PointSourcePanner> configurePolarPanner(
      const Layout& layout) {
    auto isLfe = layout.isLfe();
    if (find(isLfe.begin(), isLfe.end(), true) != isLfe.end()) {
      throw internal_error("lfe channel passed to point source panner");
    }

    checkScreenSpeakers(layout);

    if (layout.name() == std::string("0+2+0")) {
      return configureStereoPolarPanner(layout);
    } else {
      return configureFullPolarPanner(layout);
    }
  }